

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_1b0fcc::Db::parseSubstitution(Db *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  Node **ppNVar4;
  bool bVar5;
  char cVar6;
  Node *N;
  Node *pNVar7;
  int iVar8;
  undefined4 uVar9;
  size_t Index;
  Node *local_30;
  
  pcVar2 = this->First;
  pcVar3 = this->Last;
  if (pcVar2 != pcVar3) {
    iVar8 = 0;
    if (*pcVar2 != 'S') {
      return (Node *)0x0;
    }
    pcVar1 = pcVar2 + 1;
    this->First = pcVar1;
    if (pcVar3 != pcVar1) {
      iVar8 = (int)*pcVar1;
    }
    iVar8 = islower(iVar8);
    if (iVar8 != 0) {
      uVar9 = 0;
      if (pcVar3 == pcVar1) {
        cVar6 = '\0';
      }
      else {
        cVar6 = *pcVar1;
      }
      switch(cVar6) {
      case 'a':
        break;
      case 'b':
        uVar9 = 1;
        break;
      case 'c':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
        return (Node *)0x0;
      case 'd':
        uVar9 = 5;
        break;
      case 'i':
        uVar9 = 3;
        break;
      default:
        if (cVar6 == 'o') {
          uVar9 = 4;
        }
        else {
          if (cVar6 != 's') {
            return (Node *)0x0;
          }
          uVar9 = 2;
        }
      }
      this->First = pcVar2 + 2;
      N = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x10);
      N->K = KSpecialSubstitution;
      N->RHSComponentCache = No;
      N->ArrayCache = No;
      N->FunctionCache = No;
      N->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d598;
      *(undefined4 *)&N->field_0xc = uVar9;
      pNVar7 = parseAbiTags(this,N);
      if (pNVar7 == N) {
        return N;
      }
      local_30 = pNVar7;
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&local_30);
      return pNVar7;
    }
    if ((pcVar1 == pcVar3) || (*pcVar1 != '_')) {
      local_30 = (Node *)0x0;
      bVar5 = parseSeqId(this,(size_t *)&local_30);
      if (!bVar5) {
        pcVar2 = this->First;
        if ((pcVar2 != this->Last) && (*pcVar2 == '_')) {
          this->First = pcVar2 + 1;
          ppNVar4 = (this->Subs).First;
          if ((undefined1 *)((long)&local_30->_vptr_Node + 1U) <
              (undefined1 *)((long)(this->Subs).Last - (long)ppNVar4 >> 3)) {
            return ppNVar4[(long)((long)&local_30->_vptr_Node + 1)];
          }
        }
      }
    }
    else {
      this->First = pcVar2 + 2;
      ppNVar4 = (this->Subs).First;
      if (ppNVar4 != (this->Subs).Last) {
        return *ppNVar4;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }